

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O1

size_t ZSTD_compressBlock_lazy2_extDict_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  undefined8 *puVar1;
  U32 UVar2;
  U32 *pUVar3;
  seqDef *psVar4;
  bool bVar5;
  char cVar6;
  undefined8 uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  size_t sVar12;
  ulong uVar13;
  BYTE *pBVar14;
  byte bVar15;
  U32 UVar16;
  uint uVar17;
  BYTE *pBVar18;
  int *piVar19;
  BYTE *pBVar20;
  long lVar21;
  uint uVar22;
  int *piVar23;
  uint uVar24;
  ulong uVar25;
  uint uVar26;
  uint uVar27;
  ulong uVar28;
  int *ip;
  size_t ofbCandidate;
  U32 maxDistance;
  size_t local_d8;
  uint local_cc;
  int *local_c8;
  ulong local_c0;
  int local_b4;
  int *local_b0;
  BYTE *local_a8;
  ulong local_a0;
  uint local_98;
  uint local_94;
  int *local_90;
  int *local_88;
  seqStore_t *local_80;
  undefined8 local_78;
  BYTE *local_70;
  BYTE *local_68;
  ulong local_60;
  int *local_58;
  BYTE *local_50;
  int *local_48;
  uint *local_40;
  ulong local_38;
  
  local_a8 = (ms->window).base;
  local_70 = (ms->window).dictBase;
  uVar26 = (ms->window).dictLimit;
  local_a0 = (ulong)uVar26;
  local_50 = (BYTE *)(ulong)(ms->window).lowLimit;
  uVar10 = (ms->cParams).windowLog;
  local_60 = CONCAT44(local_60._4_4_,uVar10);
  uVar27 = (ms->cParams).minMatch;
  if (5 < uVar27) {
    uVar27 = 6;
  }
  if (uVar27 < 5) {
    uVar27 = 4;
  }
  local_94 = (ms->cParams).searchLog;
  local_cc = 6;
  if (local_94 < 6) {
    local_cc = local_94;
  }
  if (local_cc < 5) {
    local_cc = 4;
  }
  uVar17 = *rep;
  uVar11 = rep[1];
  ms->lazySkipping = 0;
  local_68 = local_a8 + local_a0;
  local_b4 = CONCAT31(local_b4._1_3_,local_68 == (BYTE *)src);
  local_88 = (int *)((long)src + (srcSize - 0x10));
  uVar22 = ms->nextToUpdate;
  uVar25 = (ulong)uVar22;
  uVar24 = ((int)local_88 - (int)(local_a8 + uVar25)) + 1;
  uVar8 = 8;
  if (uVar24 < 8) {
    uVar8 = uVar24;
  }
  if (local_88 < local_a8 + uVar25) {
    uVar8 = 0;
  }
  bVar15 = (byte)local_cc;
  local_98 = uVar11;
  local_90 = (int *)src;
  local_80 = seqStore;
  local_40 = rep;
  if (uVar22 < uVar8 + uVar22) {
    local_c8 = (int *)srcSize;
    if (0x20 < ms->rowHashLog + 8) {
LAB_001ea23b:
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x353,"size_t ZSTD_hashPtrSalted(const void *, U32, U32, const U64)");
    }
    pUVar3 = ms->hashTable;
    pBVar18 = ms->tagTable;
    uVar13 = ms->hashSalt;
    cVar6 = (char)ms->rowHashLog;
    local_78 = 0xcf1bbcdcbf9b0000;
    do {
      if (uVar27 == 5) {
        uVar28 = *(long *)(local_a8 + uVar25) * -0x30e4432345000000;
LAB_001e94a0:
        uVar28 = (uVar28 ^ uVar13) >> (0x38U - cVar6 & 0x3f);
      }
      else {
        if (uVar27 == 6) {
          uVar28 = *(long *)(local_a8 + uVar25) * -0x30e4432340650000;
          goto LAB_001e94a0;
        }
        uVar28 = (ulong)((*(int *)(local_a8 + uVar25) * -0x61c8864f ^ (uint)uVar13) >>
                        (0x18U - cVar6 & 0x1f));
      }
      uVar24 = ((uint)(uVar28 >> 8) & 0xffffff) << (bVar15 & 0x1f);
      if (((ulong)(pUVar3 + uVar24) & 0x3f) != 0) {
LAB_001ea143:
        __assert_fail("ZSTD_isAligned(hashTable + relRow, 64)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                      ,0x32e,
                      "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
      }
      if (((ulong)(pBVar18 + uVar24) & ~(-1L << (bVar15 & 0x3f))) != 0) {
LAB_001ea124:
        __assert_fail("ZSTD_isAligned(tagTable + relRow, (size_t)1 << rowLog)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                      ,0x32f,
                      "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
      }
      ms->hashCache[(uint)uVar25 & 7] = (U32)uVar28;
      uVar25 = uVar25 + 1;
    } while (uVar8 + uVar22 != uVar25);
  }
  piVar23 = (int *)(srcSize + (long)src);
  ip = (int *)((ulong)(local_68 == (BYTE *)src) + (long)src);
  if (ip < local_88) {
    local_58 = (int *)(local_70 + local_a0);
    local_50 = local_50 + (long)local_70;
    local_78 = CONCAT44(local_78._4_4_,1 << ((byte)uVar10 & 0x1f));
    local_b4 = uVar26 - 1;
    local_48 = piVar23 + -8;
    local_38 = ~(-1L << (bVar15 & 0x3f));
    local_c8 = piVar23;
    do {
      uVar26 = (int)ip - (int)local_a8;
      local_60 = (ulong)uVar26;
      iVar9 = uVar26 + 1;
      UVar2 = (ms->window).lowLimit;
      UVar16 = iVar9 - (uint)local_78;
      if (iVar9 - UVar2 <= (uint)local_78) {
        UVar16 = UVar2;
      }
      if (ms->loadedDictEnd != 0) {
        UVar16 = UVar2;
      }
      uVar10 = iVar9 - uVar17;
      pBVar18 = local_a8;
      if (uVar10 < (uint)local_a0) {
        pBVar18 = local_70;
      }
      local_b0 = (int *)((long)ip + 1);
      if (local_b4 - uVar10 < 3) {
LAB_001e965e:
        uVar25 = 0;
      }
      else {
        uVar25 = 0;
        if (uVar17 <= (uVar26 - UVar16) + 1) {
          if (*local_b0 != *(int *)(pBVar18 + uVar10)) goto LAB_001e965e;
          piVar19 = piVar23;
          if (uVar10 < (uint)local_a0) {
            piVar19 = local_58;
          }
          sVar12 = ZSTD_count_2segments
                             ((BYTE *)((long)ip + 5),(BYTE *)((long)(pBVar18 + uVar10) + 4),
                              (BYTE *)piVar23,(BYTE *)piVar19,local_68);
          uVar25 = sVar12 + 4;
        }
      }
      local_d8 = 999999999;
      if (uVar27 == 6) {
        if (local_cc == 6) {
          uVar13 = ZSTD_RowFindBestMatch_extDict_6_6(ms,(BYTE *)ip,(BYTE *)piVar23,&local_d8);
        }
        else if (local_cc == 5) {
          uVar13 = ZSTD_RowFindBestMatch_extDict_6_5(ms,(BYTE *)ip,(BYTE *)piVar23,&local_d8);
        }
        else {
          uVar13 = ZSTD_RowFindBestMatch_extDict_6_4(ms,(BYTE *)ip,(BYTE *)piVar23,&local_d8);
        }
      }
      else if (uVar27 == 5) {
        if (local_cc == 6) {
          uVar13 = ZSTD_RowFindBestMatch_extDict_5_6(ms,(BYTE *)ip,(BYTE *)piVar23,&local_d8);
        }
        else if (local_cc == 5) {
          uVar13 = ZSTD_RowFindBestMatch_extDict_5_5(ms,(BYTE *)ip,(BYTE *)piVar23,&local_d8);
        }
        else {
          uVar13 = ZSTD_RowFindBestMatch_extDict_5_4(ms,(BYTE *)ip,(BYTE *)piVar23,&local_d8);
        }
      }
      else if (local_cc == 6) {
        uVar13 = ZSTD_RowFindBestMatch_extDict_4_6(ms,(BYTE *)ip,(BYTE *)piVar23,&local_d8);
      }
      else if (local_cc == 5) {
        uVar13 = ZSTD_RowFindBestMatch_extDict_4_5(ms,(BYTE *)ip,(BYTE *)piVar23,&local_d8);
      }
      else {
        uVar13 = ZSTD_RowFindBestMatch_extDict_4_4(ms,(BYTE *)ip,(BYTE *)piVar23,&local_d8);
      }
      local_c0 = uVar25;
      if (uVar25 < uVar13) {
        local_c0 = uVar13;
      }
      if (local_c0 < 4) {
        uVar25 = (long)ip - (long)local_90;
        ip = (int *)((long)ip + (uVar25 >> 8) + 1);
        ms->lazySkipping = (uint)(0x8ff < uVar25);
      }
      else {
        piVar23 = ip;
        uVar28 = local_d8;
        if (uVar13 <= uVar25) {
          piVar23 = local_b0;
          uVar28 = 1;
        }
        uVar25 = local_60;
        local_b0 = piVar23;
        local_98 = uVar11;
        if (ip < local_88) {
          do {
            piVar23 = (int *)((long)ip + 1);
            uVar26 = (int)uVar25 + 1;
            uVar10 = (uint)uVar28;
            local_60 = uVar25;
            if (uVar28 == 0) {
              uVar28 = 0;
            }
            else {
              UVar2 = (ms->window).lowLimit;
              UVar16 = uVar26 - (uint)local_78;
              if (uVar26 - UVar2 <= (uint)local_78) {
                UVar16 = UVar2;
              }
              if (ms->loadedDictEnd != 0) {
                UVar16 = UVar2;
              }
              uVar11 = uVar26 - uVar17;
              pBVar18 = local_a8;
              if (uVar11 < (uint)local_a0) {
                pBVar18 = local_70;
              }
              if (((2 < local_b4 - uVar11) && (uVar17 <= uVar26 - UVar16)) &&
                 (*piVar23 == *(int *)(pBVar18 + uVar11))) {
                piVar19 = local_c8;
                if (uVar11 < (uint)local_a0) {
                  piVar19 = local_58;
                }
                sVar12 = ZSTD_count_2segments
                                   ((BYTE *)((long)ip + 5),(BYTE *)((long)(pBVar18 + uVar11) + 4),
                                    (BYTE *)local_c8,(BYTE *)piVar19,local_68);
                if (uVar10 == 0) goto LAB_001ea105;
                if (sVar12 < 0xfffffffffffffffc) {
                  uVar11 = 0x1f;
                  if (uVar10 != 0) {
                    for (; uVar10 >> uVar11 == 0; uVar11 = uVar11 - 1) {
                    }
                  }
                  if ((int)((uVar11 ^ 0x1f) + (int)local_c0 * 3 + -0x1e) < (int)(sVar12 + 4) * 3) {
                    uVar28 = 1;
                    local_c0 = sVar12 + 4;
                    local_b0 = piVar23;
                  }
                }
              }
            }
            local_d8 = 999999999;
            if (uVar27 == 6) {
              if (local_cc == 6) {
                uVar25 = ZSTD_RowFindBestMatch_extDict_6_6
                                   (ms,(BYTE *)piVar23,(BYTE *)local_c8,&local_d8);
              }
              else if (local_cc == 5) {
                uVar25 = ZSTD_RowFindBestMatch_extDict_6_5
                                   (ms,(BYTE *)piVar23,(BYTE *)local_c8,&local_d8);
              }
              else {
                uVar25 = ZSTD_RowFindBestMatch_extDict_6_4
                                   (ms,(BYTE *)piVar23,(BYTE *)local_c8,&local_d8);
              }
            }
            else if (uVar27 == 5) {
              if (local_cc == 6) {
                uVar25 = ZSTD_RowFindBestMatch_extDict_5_6
                                   (ms,(BYTE *)piVar23,(BYTE *)local_c8,&local_d8);
              }
              else if (local_cc == 5) {
                uVar25 = ZSTD_RowFindBestMatch_extDict_5_5
                                   (ms,(BYTE *)piVar23,(BYTE *)local_c8,&local_d8);
              }
              else {
                uVar25 = ZSTD_RowFindBestMatch_extDict_5_4
                                   (ms,(BYTE *)piVar23,(BYTE *)local_c8,&local_d8);
              }
            }
            else if (local_cc == 6) {
              uVar25 = ZSTD_RowFindBestMatch_extDict_4_6
                                 (ms,(BYTE *)piVar23,(BYTE *)local_c8,&local_d8);
            }
            else if (local_cc == 5) {
              uVar25 = ZSTD_RowFindBestMatch_extDict_4_5
                                 (ms,(BYTE *)piVar23,(BYTE *)local_c8,&local_d8);
            }
            else {
              uVar25 = ZSTD_RowFindBestMatch_extDict_4_4
                                 (ms,(BYTE *)piVar23,(BYTE *)local_c8,&local_d8);
            }
            uVar10 = (uint)local_d8;
            if ((uVar10 == 0) || (uVar11 = (uint)uVar28, uVar11 == 0)) {
LAB_001ea105:
              __assert_fail("val != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/bits.h"
                            ,0xab,"unsigned int ZSTD_highbit32(U32)");
            }
            bVar5 = true;
            if (3 < uVar25) {
              iVar9 = 0x1f;
              if (uVar10 != 0) {
                for (; uVar10 >> iVar9 == 0; iVar9 = iVar9 + -1) {
                }
              }
              uVar10 = 0x1f;
              if (uVar11 != 0) {
                for (; uVar11 >> uVar10 == 0; uVar10 = uVar10 - 1) {
                }
              }
              if ((int)((uVar10 ^ 0x1f) + (int)local_c0 * 4 + -0x1b) < (int)uVar25 * 4 - iVar9) {
                bVar5 = false;
                uVar28 = local_d8;
                local_c0 = uVar25;
                local_b0 = piVar23;
              }
            }
            if (bVar5) {
              if (local_88 <= piVar23) break;
              piVar23 = (int *)((long)ip + 2);
              uVar26 = (int)local_60 + 2;
              uVar10 = (uint)uVar28;
              if (uVar28 == 0) {
                uVar28 = 0;
              }
              else {
                UVar2 = (ms->window).lowLimit;
                UVar16 = uVar26 - (uint)local_78;
                if (uVar26 - UVar2 <= (uint)local_78) {
                  UVar16 = UVar2;
                }
                if (ms->loadedDictEnd != 0) {
                  UVar16 = UVar2;
                }
                uVar11 = uVar26 - uVar17;
                pBVar18 = local_a8;
                if (uVar11 < (uint)local_a0) {
                  pBVar18 = local_70;
                }
                if (((2 < local_b4 - uVar11) && (uVar17 <= uVar26 - UVar16)) &&
                   (*piVar23 == *(int *)(pBVar18 + uVar11))) {
                  piVar19 = local_c8;
                  if (uVar11 < (uint)local_a0) {
                    piVar19 = local_58;
                  }
                  sVar12 = ZSTD_count_2segments
                                     ((BYTE *)((long)ip + 6),(BYTE *)((long)(pBVar18 + uVar11) + 4),
                                      (BYTE *)local_c8,(BYTE *)piVar19,local_68);
                  if (uVar10 == 0) goto LAB_001ea105;
                  if (sVar12 < 0xfffffffffffffffc) {
                    uVar11 = 0x1f;
                    if (uVar10 != 0) {
                      for (; uVar10 >> uVar11 == 0; uVar11 = uVar11 - 1) {
                      }
                    }
                    if ((int)((uVar11 ^ 0x1f) + (int)local_c0 * 4 + -0x1e) < (int)(sVar12 + 4) * 4)
                    {
                      uVar28 = 1;
                      local_c0 = sVar12 + 4;
                      local_b0 = piVar23;
                    }
                  }
                }
              }
              local_d8 = 999999999;
              if (uVar27 == 6) {
                if (local_cc == 6) {
                  uVar25 = ZSTD_RowFindBestMatch_extDict_6_6
                                     (ms,(BYTE *)piVar23,(BYTE *)local_c8,&local_d8);
                }
                else if (local_cc == 5) {
                  uVar25 = ZSTD_RowFindBestMatch_extDict_6_5
                                     (ms,(BYTE *)piVar23,(BYTE *)local_c8,&local_d8);
                }
                else {
                  uVar25 = ZSTD_RowFindBestMatch_extDict_6_4
                                     (ms,(BYTE *)piVar23,(BYTE *)local_c8,&local_d8);
                }
              }
              else if (uVar27 == 5) {
                if (local_cc == 6) {
                  uVar25 = ZSTD_RowFindBestMatch_extDict_5_6
                                     (ms,(BYTE *)piVar23,(BYTE *)local_c8,&local_d8);
                }
                else if (local_cc == 5) {
                  uVar25 = ZSTD_RowFindBestMatch_extDict_5_5
                                     (ms,(BYTE *)piVar23,(BYTE *)local_c8,&local_d8);
                }
                else {
                  uVar25 = ZSTD_RowFindBestMatch_extDict_5_4
                                     (ms,(BYTE *)piVar23,(BYTE *)local_c8,&local_d8);
                }
              }
              else if (local_cc == 6) {
                uVar25 = ZSTD_RowFindBestMatch_extDict_4_6
                                   (ms,(BYTE *)piVar23,(BYTE *)local_c8,&local_d8);
              }
              else if (local_cc == 5) {
                uVar25 = ZSTD_RowFindBestMatch_extDict_4_5
                                   (ms,(BYTE *)piVar23,(BYTE *)local_c8,&local_d8);
              }
              else {
                uVar25 = ZSTD_RowFindBestMatch_extDict_4_4
                                   (ms,(BYTE *)piVar23,(BYTE *)local_c8,&local_d8);
              }
              uVar10 = (uint)local_d8;
              if ((uVar10 == 0) || (uVar11 = (uint)uVar28, uVar11 == 0)) goto LAB_001ea105;
              bVar5 = true;
              if (3 < uVar25) {
                iVar9 = 0x1f;
                if (uVar10 != 0) {
                  for (; uVar10 >> iVar9 == 0; iVar9 = iVar9 + -1) {
                  }
                }
                uVar10 = 0x1f;
                if (uVar11 != 0) {
                  for (; uVar11 >> uVar10 == 0; uVar10 = uVar10 - 1) {
                  }
                }
                if ((int)((uVar10 ^ 0x1f) + (int)local_c0 * 4 + -0x18) < (int)uVar25 * 4 - iVar9) {
                  bVar5 = false;
                  uVar28 = local_d8;
                  local_c0 = uVar25;
                  local_b0 = piVar23;
                }
              }
              if (bVar5) break;
            }
            uVar25 = (ulong)uVar26;
            ip = piVar23;
          } while (piVar23 < local_88);
        }
        uVar26 = uVar17;
        uVar11 = local_98;
        if (3 < uVar28) {
          pBVar20 = (BYTE *)((long)local_b0 + (3 - (long)(local_a8 + uVar28)));
          pBVar14 = local_68;
          pBVar18 = local_a8;
          if ((uint)pBVar20 < (uint)local_a0) {
            pBVar14 = local_50;
            pBVar18 = local_70;
          }
          if ((local_90 < local_b0) &&
             (uVar25 = (ulong)pBVar20 & 0xffffffff, pBVar14 < pBVar18 + uVar25)) {
            pBVar18 = pBVar18 + uVar25;
            do {
              piVar23 = (int *)((long)local_b0 + -1);
              pBVar18 = pBVar18 + -1;
              if ((*(BYTE *)piVar23 != *pBVar18) ||
                 (local_c0 = local_c0 + 1, local_b0 = piVar23, piVar23 <= local_90)) break;
            } while (pBVar14 < pBVar18);
          }
          uVar26 = (U32)uVar28 - 3;
          uVar11 = uVar17;
        }
        if (local_80->maxNbSeq <=
            (ulong)((long)local_80->sequences - (long)local_80->sequencesStart >> 3)) {
LAB_001ea181:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < local_80->maxNbLit) {
LAB_001ea1a0:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar25 = (long)local_b0 - (long)local_90;
        pBVar18 = local_80->lit;
        if (local_80->litStart + local_80->maxNbLit < pBVar18 + uVar25) {
LAB_001ea1de:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a0,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_c8 < local_b0) {
LAB_001ea162:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a1,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_48 < local_b0) {
          ZSTD_safecopyLiterals(pBVar18,(BYTE *)local_90,(BYTE *)local_b0,(BYTE *)local_48);
        }
        else {
          uVar7 = *(undefined8 *)(local_90 + 2);
          *(undefined8 *)pBVar18 = *(undefined8 *)local_90;
          *(undefined8 *)(pBVar18 + 8) = uVar7;
          if (0x10 < uVar25) {
            pBVar18 = local_80->lit;
            if ((BYTE *)0xffffffffffffffe0 < pBVar18 + 0x10 + (-0x10 - (long)(local_90 + 4))) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                            ,0xe9,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar7 = *(undefined8 *)(local_90 + 6);
            *(undefined8 *)(pBVar18 + 0x10) = *(undefined8 *)(local_90 + 4);
            *(undefined8 *)(pBVar18 + 0x18) = uVar7;
            if (0x20 < (long)uVar25) {
              lVar21 = 0;
              do {
                puVar1 = (undefined8 *)((long)local_90 + lVar21 + 0x20);
                uVar7 = puVar1[1];
                pBVar14 = pBVar18 + lVar21 + 0x20;
                *(undefined8 *)pBVar14 = *puVar1;
                *(undefined8 *)(pBVar14 + 8) = uVar7;
                puVar1 = (undefined8 *)((long)local_90 + lVar21 + 0x30);
                uVar7 = puVar1[1];
                *(undefined8 *)(pBVar14 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar14 + 0x18) = uVar7;
                lVar21 = lVar21 + 0x20;
              } while (pBVar14 + 0x20 < pBVar18 + uVar25);
            }
          }
        }
        piVar23 = local_c8;
        local_80->lit = local_80->lit + uVar25;
        if (0xffff < uVar25) {
          if (local_80->longLengthType != ZSTD_llt_none) {
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2b2,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_80->longLengthType = ZSTD_llt_literalLength;
          local_80->longLengthPos =
               (U32)((ulong)((long)local_80->sequences - (long)local_80->sequencesStart) >> 3);
        }
        psVar4 = local_80->sequences;
        psVar4->litLength = (U16)uVar25;
        psVar4->offBase = (U32)uVar28;
        if (local_c0 < 3) {
LAB_001ea1bf:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,700,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0xffff < local_c0 - 3) {
          if (local_80->longLengthType != ZSTD_llt_none) {
LAB_001ea1fd:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2bf,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_80->longLengthType = ZSTD_llt_matchLength;
          local_80->longLengthPos =
               (U32)((ulong)((long)psVar4 - (long)local_80->sequencesStart) >> 3);
        }
        psVar4->mlBase = (U16)(local_c0 - 3);
        local_80->sequences = psVar4 + 1;
        if (ms->lazySkipping != 0) {
          uVar10 = ms->nextToUpdate;
          uVar25 = (ulong)uVar10;
          uVar17 = ((int)local_88 - (int)(local_a8 + uVar25)) + 1;
          if (7 < uVar17) {
            uVar17 = 8;
          }
          if (local_88 < local_a8 + uVar25) {
            uVar17 = 0;
          }
          if (uVar10 < uVar17 + uVar10) {
            if (0x20 < ms->rowHashLog + 8) goto LAB_001ea23b;
            pUVar3 = ms->hashTable;
            pBVar18 = ms->tagTable;
            uVar13 = ms->hashSalt;
            cVar6 = (char)ms->rowHashLog;
            do {
              if (uVar27 == 5) {
                uVar28 = *(long *)(local_a8 + uVar25) * -0x30e4432345000000;
LAB_001e9ead:
                uVar28 = (uVar28 ^ uVar13) >> (0x38U - cVar6 & 0x3f);
              }
              else {
                if (uVar27 == 6) {
                  uVar28 = *(long *)(local_a8 + uVar25) * -0x30e4432340650000;
                  goto LAB_001e9ead;
                }
                uVar28 = (ulong)((*(int *)(local_a8 + uVar25) * -0x61c8864f ^ (uint)uVar13) >>
                                (0x18U - cVar6 & 0x1f));
              }
              uVar22 = ((uint)(uVar28 >> 8) & 0xffffff) << ((byte)local_cc & 0x1f);
              if (((ulong)(pUVar3 + uVar22) & 0x3f) != 0) goto LAB_001ea143;
              if ((local_38 & (ulong)(pBVar18 + uVar22)) != 0) goto LAB_001ea124;
              ms->hashCache[(uint)uVar25 & 7] = (U32)uVar28;
              uVar25 = uVar25 + 1;
            } while (uVar17 + uVar10 != uVar25);
          }
          ms->lazySkipping = 0;
        }
        ip = (int *)((long)local_b0 + local_c0);
        local_90 = ip;
        do {
          uVar17 = uVar26;
          if (local_88 < ip) break;
          iVar9 = (int)ip - (int)local_a8;
          UVar2 = (ms->window).lowLimit;
          UVar16 = iVar9 - (uint)local_78;
          if (iVar9 - UVar2 <= (uint)local_78) {
            UVar16 = UVar2;
          }
          if (ms->loadedDictEnd != 0) {
            UVar16 = UVar2;
          }
          uVar10 = iVar9 - uVar11;
          pBVar18 = local_a8;
          if (uVar10 < (uint)local_a0) {
            pBVar18 = local_70;
          }
          if (((local_b4 - uVar10 < 3) || (iVar9 - UVar16 < uVar11)) ||
             (*ip != *(int *)(pBVar18 + uVar10))) {
            bVar5 = false;
            uVar10 = uVar11;
          }
          else {
            piVar19 = piVar23;
            if (uVar10 < (uint)local_a0) {
              piVar19 = local_58;
            }
            sVar12 = ZSTD_count_2segments
                               ((BYTE *)(ip + 1),(BYTE *)((long)(pBVar18 + uVar10) + 4),
                                (BYTE *)piVar23,(BYTE *)piVar19,local_68);
            if (local_80->maxNbSeq <=
                (ulong)((long)local_80->sequences - (long)local_80->sequencesStart >> 3))
            goto LAB_001ea181;
            if (0x20000 < local_80->maxNbLit) goto LAB_001ea1a0;
            pBVar18 = local_80->lit;
            if (local_80->litStart + local_80->maxNbLit < pBVar18) goto LAB_001ea1de;
            if (piVar23 < local_90) goto LAB_001ea162;
            if (local_48 < local_90) {
              ZSTD_safecopyLiterals(pBVar18,(BYTE *)local_90,(BYTE *)local_90,(BYTE *)local_48);
            }
            else {
              uVar7 = *(undefined8 *)(local_90 + 2);
              *(undefined8 *)pBVar18 = *(undefined8 *)local_90;
              *(undefined8 *)(pBVar18 + 8) = uVar7;
            }
            psVar4 = local_80->sequences;
            psVar4->litLength = 0;
            psVar4->offBase = 1;
            if (sVar12 + 4 < 3) goto LAB_001ea1bf;
            if (0xffff < sVar12 + 1) {
              if (local_80->longLengthType != ZSTD_llt_none) goto LAB_001ea1fd;
              local_80->longLengthType = ZSTD_llt_matchLength;
              local_80->longLengthPos =
                   (U32)((ulong)((long)psVar4 - (long)local_80->sequencesStart) >> 3);
            }
            psVar4->mlBase = (U16)(sVar12 + 1);
            local_80->sequences = psVar4 + 1;
            ip = (int *)((long)ip + sVar12 + 4);
            bVar5 = true;
            uVar10 = uVar26;
            uVar26 = uVar11;
            local_90 = ip;
          }
          uVar11 = uVar10;
          uVar17 = uVar26;
        } while (bVar5);
      }
    } while (ip < local_88);
  }
  *local_40 = uVar17;
  local_40[1] = uVar11;
  return (long)piVar23 - (long)local_90;
}

Assistant:

size_t ZSTD_compressBlock_lazy2_extDict_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 2);
}